

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O1

void __thiscall
Omega_h::Mesh::set_parting(Mesh *this,Omega_h_Parting parting_in,Int nlayers,bool verbose)

{
  Omega_h_Parting OVar1;
  I32 IVar2;
  undefined7 in_register_00000009;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  
  if (((int)CONCAT71(in_register_00000009,verbose) != 0) &&
     (IVar2 = Comm::rank((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr), IVar2 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"going to ",9);
    if (parting_in == OMEGA_H_VERT_BASED) {
      poVar6 = (ostream *)&std::cout;
      pcVar5 = "vertex based";
      lVar4 = 0xc;
LAB_0032ab71:
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar4);
    }
    else {
      if (parting_in == OMEGA_H_GHOSTED) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ghosted (",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nlayers);
        pcVar5 = " layers)";
        lVar4 = 8;
        goto LAB_0032ab71;
      }
      if (parting_in == OMEGA_H_ELEM_BASED) {
        poVar6 = (ostream *)&std::cout;
        pcVar5 = "element based";
        lVar4 = 0xd;
        goto LAB_0032ab71;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," partitioning\n",0xe);
  }
  OVar1 = this->parting_;
  if (OVar1 != ~OMEGA_H_ELEM_BASED) {
    if (this->nghost_layers_ == nlayers && OVar1 == parting_in) {
      return;
    }
    if (parting_in == OMEGA_H_VERT_BASED) {
      if (nlayers != 1) {
        pcVar5 = "nlayers == 1";
        uVar3 = 0x208;
LAB_0032ac89:
        fail("assertion %s failed at %s +%d\n",pcVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,uVar3);
      }
      IVar2 = Comm::size((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (1 < IVar2) {
        partition_by_verts(this,verbose);
      }
    }
    else if (parting_in == OMEGA_H_GHOSTED) {
      if (nlayers < this->nghost_layers_ || OVar1 != OMEGA_H_GHOSTED) {
        set_parting(this,OMEGA_H_ELEM_BASED,0,false);
      }
      IVar2 = Comm::size((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (1 < IVar2) {
        ghost_mesh(this,nlayers,verbose);
      }
    }
    else if (parting_in == OMEGA_H_ELEM_BASED) {
      if (nlayers != 0) {
        pcVar5 = "nlayers == 0";
        uVar3 = 0x200;
        goto LAB_0032ac89;
      }
      IVar2 = Comm::size((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (1 < IVar2) {
        partition_by_elems(this,verbose);
      }
    }
  }
  this->parting_ = parting_in;
  this->nghost_layers_ = nlayers;
  return;
}

Assistant:

void Mesh::set_parting(Omega_h_Parting parting_in, Int nlayers, bool verbose) {
  if (verbose && comm_->rank() == 0) {
    std::cout << "going to ";
    switch (parting_in) {
      case OMEGA_H_ELEM_BASED:
        std::cout << "element based";
        break;
      case OMEGA_H_VERT_BASED:
        std::cout << "vertex based";
        break;
      case OMEGA_H_GHOSTED:
        std::cout << "ghosted (" << nlayers << " layers)";
        break;
    }
    std::cout << " partitioning\n";
  }
  if (parting_ == -1) {
    parting_ = parting_in;
    nghost_layers_ = nlayers;
    return;
  }
  if (parting_ == parting_in && nghost_layers_ == nlayers) {
    return;
  }
  if (parting_in == OMEGA_H_ELEM_BASED) {
    OMEGA_H_CHECK(nlayers == 0);
    if (comm_->size() > 1) partition_by_elems(this, verbose);
  } else if (parting_in == OMEGA_H_GHOSTED) {
    if (parting_ != OMEGA_H_GHOSTED || nlayers < nghost_layers_) {
      set_parting(OMEGA_H_ELEM_BASED, 0, false);
    }
    if (comm_->size() > 1) ghost_mesh(this, nlayers, verbose);
  } else if (parting_in == OMEGA_H_VERT_BASED) {
    OMEGA_H_CHECK(nlayers == 1);
    if (comm_->size() > 1) partition_by_verts(this, verbose);
  }
  parting_ = parting_in;
  nghost_layers_ = nlayers;
}